

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O2

bool tchecker::refdbm::is_le(db_t *rdbm1,db_t *rdbm2,reference_clock_variables_t *r)

{
  bool bVar1;
  size_t sVar2;
  
  if (rdbm1 == (db_t *)0x0) {
    __assert_fail("rdbm1 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf2,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  if (rdbm2 == (db_t *)0x0) {
    __assert_fail("rdbm2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf3,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_consistent(rdbm1,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf4,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  bVar1 = is_consistent(rdbm2,r);
  if (bVar1) {
    bVar1 = is_tight(rdbm1,r);
    if (!bVar1) {
      __assert_fail("tchecker::refdbm::is_tight(rdbm1, r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                    ,0xf6,
                    "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                   );
    }
    bVar1 = is_tight(rdbm2,r);
    if (bVar1) {
      sVar2 = index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)r);
      bVar1 = tchecker::dbm::is_le(rdbm1,rdbm2,(clock_id_t)sVar2);
      return bVar1;
    }
    __assert_fail("tchecker::refdbm::is_tight(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0xf7,
                  "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
                 );
  }
  __assert_fail("tchecker::refdbm::is_consistent(rdbm2, r)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0xf5,
                "bool tchecker::refdbm::is_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &)"
               );
}

Assistant:

bool is_le(tchecker::dbm::db_t const * rdbm1, tchecker::dbm::db_t const * rdbm2,
           tchecker::reference_clock_variables_t const & r)
{
  assert(rdbm1 != nullptr);
  assert(rdbm2 != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm1, r));
  assert(tchecker::refdbm::is_consistent(rdbm2, r));
  assert(tchecker::refdbm::is_tight(rdbm1, r));
  assert(tchecker::refdbm::is_tight(rdbm2, r));
  return tchecker::dbm::is_le(rdbm1, rdbm2, r.size());
}